

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

PClassActor * CreateNewActor(FScriptPosition *sc,FName *typeName,FName *parentName)

{
  FName *pFVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  PClassActor *pPVar5;
  FName local_4c;
  PClassActor *local_48;
  PClassActor *p;
  PClassActor *local_38;
  PClassActor *parent;
  PClassActor *ti;
  PClassActor *replacee;
  FName *parentName_local;
  FName *typeName_local;
  FScriptPosition *sc_local;
  
  ti = (PClassActor *)0x0;
  parent = (PClassActor *)0x0;
  local_38 = (PClassActor *)AActor::RegistrationInfo.MyClass;
  replacee = (PClassActor *)parentName;
  parentName_local = typeName;
  typeName_local = (FName *)sc;
  bVar2 = FName::operator!=(parentName,NAME_None);
  if (bVar2) {
    FName::FName((FName *)((long)&p + 4),parentName);
    local_48 = PClass::FindActor((FName *)((long)&p + 4));
    local_38 = local_48;
    for (; local_48 != (PClassActor *)0x0;
        local_48 = dyn_cast<PClassActor>((DObject *)(local_48->super_PClass).ParentClass)) {
      bVar2 = FName::operator==(&(local_48->super_PClass).super_PNativeStruct.super_PStruct.
                                 super_PNamedType.TypeName,typeName);
      pFVar1 = typeName_local;
      if (bVar2) {
        pcVar3 = FName::GetChars(typeName);
        FScriptPosition::Message
                  ((FScriptPosition *)pFVar1,2,"\'%s\' inherits from a class with the same name",
                   pcVar3);
        break;
      }
    }
    pFVar1 = typeName_local;
    if (local_38 == (PClassActor *)0x0) {
      pcVar3 = FName::GetChars(parentName);
      pcVar4 = FName::GetChars(typeName);
      FScriptPosition::Message
                ((FScriptPosition *)pFVar1,2,"Parent type \'%s\' not found in %s",pcVar3,pcVar4);
      local_38 = (PClassActor *)AActor::RegistrationInfo.MyClass;
    }
    else {
      bVar2 = PClass::IsDescendantOf(&local_38->super_PClass,AActor::RegistrationInfo.MyClass);
      pFVar1 = typeName_local;
      if (!bVar2) {
        pcVar3 = FName::GetChars(parentName);
        pcVar4 = FName::GetChars(typeName);
        FScriptPosition::Message
                  ((FScriptPosition *)pFVar1,2,"Parent type \'%s\' is not an actor in %s",pcVar3,
                   pcVar4);
        local_38 = (PClassActor *)AActor::RegistrationInfo.MyClass;
      }
    }
  }
  pFVar1 = typeName_local;
  pPVar5 = local_38;
  FName::FName(&local_4c,typeName);
  pPVar5 = DecoDerivedClass((FScriptPosition *)pFVar1,pPVar5,&local_4c);
  (pPVar5->super_PClass).bDecorateClass = true;
  pPVar5->Replacement = (PClassActor *)0x0;
  pPVar5->Replacee = (PClassActor *)0x0;
  pPVar5->DoomEdNum = -1;
  return pPVar5;
}

Assistant:

PClassActor *CreateNewActor(const FScriptPosition &sc, FName typeName, FName parentName)
{
	PClassActor *replacee = NULL;
	PClassActor *ti = NULL;

	PClassActor *parent = RUNTIME_CLASS(AActor);

	if (parentName != NAME_None)
	{
		parent = PClass::FindActor(parentName);

		PClassActor *p = parent;
		while (p != NULL)
		{
			if (p->TypeName == typeName)
			{
				sc.Message(MSG_ERROR, "'%s' inherits from a class with the same name", typeName.GetChars());
				break;
			}
			p = dyn_cast<PClassActor>(p->ParentClass);
		}

		if (parent == NULL)
		{
			sc.Message(MSG_ERROR, "Parent type '%s' not found in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
		else if (!parent->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			sc.Message(MSG_ERROR, "Parent type '%s' is not an actor in %s", parentName.GetChars(), typeName.GetChars());
			parent = RUNTIME_CLASS(AActor);
		}
	}
	ti = DecoDerivedClass(sc, parent, typeName);
	ti->bDecorateClass = true;	// we only set this for 'modern' DECORATE. The original stuff  is so limited that it cannot do anything that may require flagging.

	ti->Replacee = ti->Replacement = NULL;
	ti->DoomEdNum = -1;
	return ti;
}